

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

vector<QPDFExc,_std::allocator<QPDFExc>_> * __thiscall
QPDF::getWarnings(vector<QPDFExc,_std::allocator<QPDFExc>_> *__return_storage_ptr__,QPDF *this)

{
  pointer pMVar1;
  QPDF *this_local;
  vector<QPDFExc,_std::allocator<QPDFExc>_> *result;
  
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::vector(__return_storage_ptr__,&pMVar1->warnings);
  pMVar1 = std::unique_ptr<QPDF::Members,_std::default_delete<QPDF::Members>_>::operator->(&this->m)
  ;
  std::vector<QPDFExc,_std::allocator<QPDFExc>_>::clear(&pMVar1->warnings);
  return __return_storage_ptr__;
}

Assistant:

std::vector<QPDFExc>
QPDF::getWarnings()
{
    std::vector<QPDFExc> result = m->warnings;
    m->warnings.clear();
    return result;
}